

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
cbtCompoundCollisionAlgorithm::preallocateChildAlgorithms
          (cbtCompoundCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap)

{
  uint uVar1;
  uint uVar2;
  cbtCollisionShape *pcVar3;
  cbtCollisionAlgorithm **ptr;
  cbtDispatcher *pcVar4;
  int i;
  uint uVar5;
  int iVar6;
  cbtCollisionAlgorithm **ppcVar7;
  long lVar8;
  undefined4 extraout_var;
  ulong uVar9;
  cbtCollisionObjectWrapper *pcVar10;
  cbtAlignedObjectArray<cbtCollisionAlgorithm_*> m_childCollisionAlgorithmsClosestPoints;
  cbtAlignedObjectArray<cbtCollisionAlgorithm_*> m_childCollisionAlgorithmsContact;
  cbtCollisionObjectWrapper *local_98;
  undefined8 local_90;
  cbtCollisionObject *local_88;
  cbtTransform *pcStack_80;
  undefined4 local_78;
  undefined4 local_74;
  cbtAlignedObjectArray<cbtCollisionAlgorithm_*> local_70;
  cbtAlignedObjectArray<cbtCollisionAlgorithm_*> local_50;
  
  uVar1 = (this->m_childCollisionAlgorithms).m_size;
  pcVar10 = body1Wrap;
  if (this->m_isSwapped != false) {
    pcVar10 = body0Wrap;
    body0Wrap = body1Wrap;
  }
  pcVar3 = body0Wrap->m_shape;
  uVar2 = *(uint *)((long)&pcVar3[1]._vptr_cbtCollisionShape + 4);
  if ((int)uVar1 < (int)uVar2) {
    if ((this->m_childCollisionAlgorithms).m_capacity < (int)uVar2) {
      if (uVar2 == 0) {
        ppcVar7 = (cbtCollisionAlgorithm **)0x0;
        uVar5 = uVar1;
      }
      else {
        ppcVar7 = (cbtCollisionAlgorithm **)cbtAlignedAllocInternal((long)(int)uVar2 * 8,0x10);
        uVar5 = (this->m_childCollisionAlgorithms).m_size;
      }
      if (0 < (int)uVar5) {
        uVar9 = 0;
        do {
          ppcVar7[uVar9] = (this->m_childCollisionAlgorithms).m_data[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar5 != uVar9);
      }
      ptr = (this->m_childCollisionAlgorithms).m_data;
      if ((ptr != (cbtCollisionAlgorithm **)0x0) &&
         ((this->m_childCollisionAlgorithms).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(ptr);
      }
      (this->m_childCollisionAlgorithms).m_ownsMemory = true;
      (this->m_childCollisionAlgorithms).m_data = ppcVar7;
      (this->m_childCollisionAlgorithms).m_capacity = uVar2;
    }
    lVar8 = (long)(int)uVar1;
    do {
      (this->m_childCollisionAlgorithms).m_data[lVar8] = (cbtCollisionAlgorithm *)0x0;
      lVar8 = lVar8 + 1;
    } while ((int)uVar2 != lVar8);
  }
  (this->m_childCollisionAlgorithms).m_size = uVar2;
  if (0 < (int)uVar2) {
    lVar8 = 0x40;
    uVar9 = 0;
    do {
      if (pcVar3[3]._vptr_cbtCollisionShape == (_func_int **)0x0) {
        local_90 = *(undefined8 *)((long)pcVar3[1].m_userPointer + lVar8);
        local_88 = body0Wrap->m_collisionObject;
        pcStack_80 = body0Wrap->m_worldTransform;
        local_78 = 0xffffffff;
        local_74 = (undefined4)uVar9;
        pcVar4 = (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
                 m_dispatcher;
        local_98 = body0Wrap;
        iVar6 = (*pcVar4->_vptr_cbtDispatcher[2])(pcVar4,&local_98,pcVar10,this->m_sharedManifold,1)
        ;
        (this->m_childCollisionAlgorithms).m_data[uVar9] =
             (cbtCollisionAlgorithm *)CONCAT44(extraout_var,iVar6);
        local_50.m_ownsMemory = true;
        local_50.m_data = (cbtCollisionAlgorithm **)0x0;
        local_70.m_ownsMemory = true;
        local_70.m_data = (cbtCollisionAlgorithm **)0x0;
        local_50.m_size = 0;
        local_50.m_capacity = 0;
        local_70.m_size = 0;
        local_70.m_capacity = 0;
        cbtAlignedObjectArray<cbtCollisionAlgorithm_*>::~cbtAlignedObjectArray(&local_70);
        cbtAlignedObjectArray<cbtCollisionAlgorithm_*>::~cbtAlignedObjectArray(&local_50);
      }
      else {
        (this->m_childCollisionAlgorithms).m_data[uVar9] = (cbtCollisionAlgorithm *)0x0;
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x58;
    } while (uVar2 != uVar9);
  }
  return;
}

Assistant:

void cbtCompoundCollisionAlgorithm::preallocateChildAlgorithms(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap)
{
	const cbtCollisionObjectWrapper* colObjWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const cbtCollisionObjectWrapper* otherObjWrap = m_isSwapped ? body0Wrap : body1Wrap;
	cbtAssert(colObjWrap->getCollisionShape()->isCompound());

	const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(colObjWrap->getCollisionShape());

	int numChildren = compoundShape->getNumChildShapes();
	int i;

	m_childCollisionAlgorithms.resize(numChildren);
	for (i = 0; i < numChildren; i++)
	{
		if (compoundShape->getDynamicAabbTree())
		{
			m_childCollisionAlgorithms[i] = 0;
		}
		else
		{
			const cbtCollisionShape* childShape = compoundShape->getChildShape(i);

			cbtCollisionObjectWrapper childWrap(colObjWrap, childShape, colObjWrap->getCollisionObject(), colObjWrap->getWorldTransform(), -1, i);  //wrong child trans, but unused (hopefully)
			m_childCollisionAlgorithms[i] = m_dispatcher->findAlgorithm(&childWrap, otherObjWrap, m_sharedManifold, BT_CONTACT_POINT_ALGORITHMS);

			cbtAlignedObjectArray<cbtCollisionAlgorithm*> m_childCollisionAlgorithmsContact;
			cbtAlignedObjectArray<cbtCollisionAlgorithm*> m_childCollisionAlgorithmsClosestPoints;
		}
	}
}